

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

bool __thiscall chatra::Thread::assignmentOperator(Thread *this)

{
  pointer *this_00;
  int iVar1;
  unsigned_long *puVar2;
  bool bVar3;
  EvaluateValueResult EVar4;
  Type TVar5;
  reference pvVar6;
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *pvVar7;
  size_t sVar8;
  TemporaryTuple *this_01;
  Tuple *pTVar9;
  vector<std::unique_ptr<chatra::Token,_std::default_delete<chatra::Token>_>,_std::allocator<std::unique_ptr<chatra::Token,_std::default_delete<chatra::Token>_>_>_>
  *pvVar10;
  reference pvVar11;
  reference ppTVar12;
  size_type sVar13;
  Method *pMVar14;
  TemporaryObject *pTVar15;
  Array *this_02;
  ReferenceValueType *pRVar16;
  Reference ref_00;
  Dict *this_03;
  reference puVar17;
  reference ppTVar18;
  __shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *p_Var19;
  element_type *peVar20;
  RuntimeException *pRVar21;
  Class *pCVar22;
  Class *pCVar23;
  InternalError *this_04;
  ArgumentSpec arg;
  ArgumentSpec arg_00;
  Class *local_688;
  bool local_565;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_538;
  allocator local_519;
  string local_518;
  Reference local_4f8;
  Reference ref_1;
  __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
  local_4e8;
  TemporaryObject *local_4e0;
  TemporaryObject *v0_4;
  ReferenceNode *local_4d0;
  string local_4c8;
  Key *local_4a8;
  Key *key;
  size_t sourceIndex_1;
  iterator __end8_1;
  iterator __begin8_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range8_1;
  Dict *dict;
  size_t sourceIndex;
  iterator __end8;
  iterator __begin8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range8;
  Array *array;
  Reference srcRef;
  value_type *e_1;
  pointer pbStack_430;
  pointer local_428;
  allocator local_411;
  string local_410;
  TemporaryObject *local_3f0;
  TemporaryObject *v0_3;
  Class *local_3e0;
  ReferenceNode *local_3d8;
  Class *local_3d0;
  Class *cl;
  value_type *e;
  ulong local_3b8;
  size_t subPhase;
  size_t position;
  size_t phase;
  size_t phasesPerElem;
  TupleAssignmentMap *local_390;
  TupleAssignmentMap *map_1;
  Tuple *local_380;
  Tuple *tuple_1;
  TemporaryTuple *local_370;
  TemporaryTuple *tmp;
  ReferenceNode *local_360;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_358;
  allocator local_331;
  string local_330;
  Reference local_310;
  Reference ref;
  __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
  local_300;
  TemporaryObject *local_2f8;
  TemporaryObject *v1_1;
  __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
  local_2e8;
  TemporaryObject *local_2e0;
  TemporaryObject *v0_2;
  pointer pbStack_2d0;
  pointer local_2c8;
  allocator local_2b1;
  string local_2b0;
  __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
  local_290;
  __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
  local_288;
  TemporaryObject *local_280;
  TemporaryObject *v0_1;
  __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
  local_270;
  ReferenceNode *local_268;
  ArgumentSpec local_260;
  Reference local_250;
  size_type local_248;
  vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
  *local_240;
  vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
  *local_238;
  vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
  *local_230;
  Reference local_228;
  Reference local_220;
  ArgumentMatcher local_218;
  undefined1 local_190 [8];
  vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
  map;
  allocator local_159;
  string local_158;
  Reference local_138;
  Reference local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128 [2];
  allocator local_f1;
  string local_f0;
  Reference local_d0;
  Tuple *local_c8;
  Tuple *tuple;
  bool local_b1;
  Reference RStack_b0;
  bool v1IsTuple;
  bool local_a1;
  iterator iStack_a0;
  bool v0IsTuple;
  __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
  local_98;
  TemporaryObject *local_90;
  TemporaryObject *v1;
  __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
  local_80;
  TemporaryObject *local_78;
  TemporaryObject *v0;
  element_type *local_68;
  int local_5c;
  element_type *local_58;
  undefined8 local_50;
  size_t phaseTuple;
  size_t phaseFunctionObject;
  size_t phaseMethod;
  size_t phaseReference;
  unsigned_long *nodePhase;
  Node *node;
  value_type *f;
  Thread *this_local;
  
  f = (value_type *)this;
  node = (Node *)std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>::back(&this->frames);
  pvVar6 = std::
           vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
           ::back(&((reference)node)->stack);
  nodePhase = (unsigned_long *)pvVar6->first;
  pvVar6 = std::
           vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
           ::back((vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
                   *)&node->annotations);
  phaseReference = (size_t)&pvVar6->second;
  phaseMethod = 10;
  phaseFunctionObject = 0x14;
  phaseTuple = 0x1e;
  local_50 = 0x28;
  switch(*(unsigned_long *)phaseReference) {
  case 0:
    *(unsigned_long *)phaseReference = *(unsigned_long *)phaseReference + 1;
    pvVar7 = &node->annotations;
    p_Var19 = &std::
               vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               ::operator[]((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                             *)(nodePhase + 0xc),0)->
               super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
    local_58 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get(p_Var19);
    local_5c = 0;
    std::
    vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
    ::emplace_back<chatra::Node*,int>
              ((vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
                *)pvVar7,&local_58,&local_5c);
    this_local._7_1_ = 1;
    break;
  case 1:
    *(unsigned_long *)phaseReference = *(unsigned_long *)phaseReference + 1;
    pvVar7 = &node->annotations;
    p_Var19 = &std::
               vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               ::operator[]((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                             *)(nodePhase + 0xc),1)->
               super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
    local_68 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get(p_Var19);
    v0._4_4_ = 0;
    std::
    vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
    ::emplace_back<chatra::Node*,int>
              ((vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
                *)pvVar7,&local_68,(int *)((long)&v0 + 4));
    this_local._7_1_ = 1;
    break;
  case 2:
    EVar4 = evaluateValue(this,Value);
    if (EVar4 == Suspend) {
      this_local._7_1_ = 0;
      break;
    }
    if (EVar4 == StackChanged) {
      this_local._7_1_ = 1;
      break;
    }
  case 3:
    *(undefined8 *)phaseReference = 6;
switchD_0020a96d_caseD_6:
    v1 = (TemporaryObject *)
         std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>::end
                   ((vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_> *
                    )&node->additionalTokens);
    local_80 = __gnu_cxx::
               __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
               ::operator-((__normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
                            *)&v1,2);
    ppTVar18 = __gnu_cxx::
               __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
               ::operator*(&local_80);
    local_78 = *ppTVar18;
    iStack_a0 = std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>::
                end((vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_> *
                    )&node->additionalTokens);
    local_98 = __gnu_cxx::
               __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
               ::operator-(&stack0xffffffffffffff60,1);
    ppTVar18 = __gnu_cxx::
               __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
               ::operator*(&local_98);
    local_90 = *ppTVar18;
    TVar5 = TemporaryObject::getType(local_78);
    local_565 = false;
    if (TVar5 == Rvalue) {
      RStack_b0 = TemporaryObject::getRef(local_78);
      pCVar22 = getReferClass(RStack_b0);
      pCVar23 = PreDefined<chatra::TemporaryTuple,_(chatra::StringId)157>::getClassStatic();
      local_565 = pCVar22 == pCVar23;
    }
    local_a1 = local_565;
    tuple = (Tuple *)TemporaryObject::getRef(local_90);
    pCVar22 = getReferClass((Reference)tuple);
    pCVar23 = PreDefined<chatra::Tuple,_(chatra::StringId)156>::getClassStatic();
    local_b1 = pCVar22 == pCVar23;
    if (((local_a1 & 1U) == 0) && (local_b1)) {
      local_d0 = TemporaryObject::getRef(local_90);
      local_c8 = Reference::deref<chatra::Tuple>(&local_d0);
      sVar8 = Tuple::tupleSize(local_c8);
      puVar2 = nodePhase;
      if (sVar8 != 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_f0,
                   "left side is not tuple even through value of right side is tuple",&local_f1);
        local_128[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_128[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_128[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(local_128);
        errorAtNode(&this->super_IErrorReceiver,Error,(Node *)puVar2,&local_f0,local_128);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_128);
        std::__cxx11::string::~string((string *)&local_f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_f1);
        pRVar21 = (RuntimeException *)__cxa_allocate_exception(0x10);
        RuntimeException::RuntimeException(pRVar21,UnsupportedOperationException);
        __cxa_throw(pRVar21,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
      }
      local_130 = TemporaryObject::getRef(local_90);
      local_138 = Object::ref((Object *)local_c8,0);
      Reference::set(&local_130,&local_138);
      local_b1 = false;
    }
    puVar2 = nodePhase;
    pTVar15 = local_78;
    if ((local_a1 & 1U) == 0) {
      local_268 = (ReferenceNode *)TemporaryObject::getRef(local_90);
      pCVar22 = getReferClass((Reference)local_268);
      ArgumentSpec::ArgumentSpec(&local_260,Invalid,pCVar22);
      arg._4_4_ = 0;
      arg.key = local_260.key;
      arg.cl = local_260.cl;
      TemporaryObject::addAssignment(pTVar15,(Node *)puVar2,arg);
      *(long *)phaseReference = *(long *)phaseReference + 1;
switchD_0020a96d_caseD_7:
      p_Var19 = &std::
                 vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ::operator[]((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                               *)(nodePhase + 0xc),0)->
                 super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
      peVar20 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get(p_Var19);
      v0_1 = (TemporaryObject *)
             std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>::end
                       ((vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                         *)&node->additionalTokens);
      local_270 = __gnu_cxx::
                  __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
                  ::operator-((__normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
                               *)&v0_1,2);
      ppTVar18 = __gnu_cxx::
                 __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
                 ::operator*(&local_270);
      EVar4 = evaluateAndAllocateForAssignment(this,peVar20,*ppTVar18);
      if (EVar4 == Next) {
switchD_0020a96d_caseD_8:
        local_290._M_current =
             (TemporaryObject **)
             std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>::end
                       ((vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                         *)&node->additionalTokens);
        local_288 = __gnu_cxx::
                    __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
                    ::operator-(&local_290,2);
        ppTVar18 = __gnu_cxx::
                   __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
                   ::operator*(&local_288);
        local_280 = *ppTVar18;
        TVar5 = TemporaryObject::getType(local_280);
        if (TVar5 - FrameMethod < 2) {
          pMVar14 = TemporaryObject::getSetMethod(local_280);
          if (pMVar14 == (Method *)0x0) goto LAB_0020b22d;
          *(undefined8 *)phaseReference = 0x14;
          this_local._7_1_ = 1;
        }
        else {
          if (TVar5 != ScopeRef && TVar5 != ObjectRef) {
LAB_0020b22d:
            p_Var19 = &std::
                       vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                       ::operator[]((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                     *)(nodePhase + 0xc),0)->
                       super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
            peVar20 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get(p_Var19);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_2b0,"expression is not assignable",&local_2b1);
            v0_2 = (TemporaryObject *)0x0;
            pbStack_2d0 = (pointer)0x0;
            local_2c8 = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&v0_2);
            errorAtNode(&this->super_IErrorReceiver,Error,peVar20,&local_2b0,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&v0_2);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&v0_2);
            std::__cxx11::string::~string((string *)&local_2b0);
            std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
            pRVar21 = (RuntimeException *)__cxa_allocate_exception(0x10);
            RuntimeException::RuntimeException(pRVar21,UnsupportedOperationException);
            __cxa_throw(pRVar21,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
          }
          *(undefined8 *)phaseReference = 10;
          this_local._7_1_ = 1;
        }
      }
      else {
        this_local._7_1_ = 0;
      }
    }
    else {
      if (local_b1 == false) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_158,"right side is not tuple",&local_159);
        map.
        super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        this_00 = &map.
                   super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_00);
        errorAtNode(&this->super_IErrorReceiver,Error,(Node *)puVar2,&local_158,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&map.
                      super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string((string *)&local_158);
        std::allocator<char>::~allocator((allocator<char> *)&local_159);
        pRVar21 = (RuntimeException *)__cxa_allocate_exception(0x10);
        RuntimeException::RuntimeException(pRVar21,UnsupportedOperationException);
        __cxa_throw(pRVar21,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
      }
      std::
      vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
      ::vector((vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                *)local_190);
      local_220 = TemporaryObject::getRef(local_78);
      this_01 = Reference::deref<chatra::TemporaryTuple>(&local_220);
      TemporaryTuple::toArgumentMatcher(&local_218,this_01);
      local_228 = TemporaryObject::getRef(local_90);
      pTVar9 = Reference::deref<chatra::Tuple>(&local_228);
      local_240 = (vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                   *)local_190;
      local_238 = local_240;
      local_230 = local_240;
      ArgumentMatcher::
      mapReturns<chatra::Tuple,chatra::Thread::assignmentOperator()::__0,chatra::Thread::assignmentOperator()::__1,chatra::Thread::assignmentOperator()::__2>
                (&local_218,pTVar9,(anon_class_8_1_ba1d60bc)local_240,
                 (anon_class_8_1_ba1d60bc)local_240,(anon_class_8_1_ba1d60bc)local_240);
      ArgumentMatcher::~ArgumentMatcher(&local_218);
      pvVar7 = &node->symbols;
      local_248 = std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                  ::size((vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                          *)&node->additionalTokens);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)pvVar7,&local_248);
      pTVar15 = Frame::pushTemporary((Frame *)node);
      local_250 = TemporaryObject::setRvalue(pTVar15);
      Reference::
      allocate<chatra::TupleAssignmentMap,std::vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>>
                (&local_250,
                 (vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                  *)local_190);
      *(undefined8 *)phaseReference = 0x28;
      this_local._7_1_ = 1;
      std::
      vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
      ::~vector((vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                 *)local_190);
    }
    break;
  default:
    if (*(ulong *)phaseReference < 0x28) {
      this_04 = (InternalError *)__cxa_allocate_exception(8);
      memset(this_04,0,8);
      InternalError::InternalError(this_04);
      __cxa_throw(this_04,&InternalError::typeinfo,InternalError::~InternalError);
    }
    pvVar10 = &node->additionalTokens;
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&node->symbols);
    ppTVar12 = std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>::
               operator[]((vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                           *)pvVar10,*pvVar11 - 2);
    tuple_1 = (Tuple *)TemporaryObject::getRef(*ppTVar12);
    local_370 = Reference::deref<chatra::TemporaryTuple>((Reference *)&tuple_1);
    pvVar10 = &node->additionalTokens;
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&node->symbols);
    ppTVar12 = std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>::
               operator[]((vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                           *)pvVar10,*pvVar11 - 1);
    map_1 = (TupleAssignmentMap *)TemporaryObject::getRef(*ppTVar12);
    local_380 = Reference::deref<chatra::Tuple>((Reference *)&map_1);
    pvVar10 = &node->additionalTokens;
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&node->symbols);
    ppTVar12 = std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>::
               operator[]((vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                           *)pvVar10,*pvVar11);
    phasesPerElem = (size_t)TemporaryObject::getRef(*ppTVar12);
    local_390 = Reference::deref<chatra::TupleAssignmentMap>((Reference *)&phasesPerElem);
    phase = 4;
    do {
      position = *(long *)phaseReference - 0x28;
      subPhase = position >> 2;
      local_3b8 = (ulong)((uint)position & 3);
      if (local_3b8 == 0) {
        sVar13 = std::
                 vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                 ::size(&local_390->map);
        if (sVar13 <= subPhase) {
          Frame::popTemporaryTuple((Frame *)node);
          Frame::pop((Frame *)node);
          Frame::pop((Frame *)node);
          Frame::pop((Frame *)node);
          pTVar15 = Frame::pushTemporary((Frame *)node);
          e = (value_type *)TemporaryObject::setRvalue(pTVar15);
          Reference::setNull((Reference *)&e);
          std::
          vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
          ::pop_back((vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
                      *)&node->annotations);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&node->symbols);
          this_local._7_1_ = 1;
          break;
        }
        cl = (Class *)std::
                      vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                      ::operator[](&local_390->map,subPhase);
        TemporaryTuple::extract(local_370,(size_t)cl->package);
        iVar1 = *(int *)&(cl->directParents).
                         super__Vector_base<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
        if (iVar1 == 1) {
          local_3d0 = Array::getClassStatic();
        }
        else if (iVar1 == 3) {
          local_3d0 = Dict::getClassStatic();
        }
        else {
          bVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&cl->node);
          pTVar9 = local_380;
          if (bVar3) {
            local_688 = (Class *)0x0;
          }
          else {
            pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&cl->node,
                                 0);
            local_3d8 = (ReferenceNode *)Object::ref((Object *)pTVar9,*pvVar11);
            local_688 = getReferClass((Reference)local_3d8);
          }
          local_3d0 = local_688;
        }
        if (local_3d0 != (Class *)0x0) {
          ppTVar12 = std::
                     vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>::
                     back((vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                           *)&node->additionalTokens);
          puVar2 = nodePhase;
          pTVar15 = *ppTVar12;
          ArgumentSpec::ArgumentSpec((ArgumentSpec *)&v0_3,Invalid,local_3d0);
          arg_00._4_4_ = 0;
          arg_00.key = (uint)v0_3;
          arg_00.cl = local_3e0;
          TemporaryObject::addAssignment(pTVar15,(Node *)puVar2,arg_00);
        }
        *(long *)phaseReference = *(long *)phaseReference + 1;
LAB_0020ba02:
        p_Var19 = &std::
                   vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ::operator[]((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                 *)(nodePhase + 0xc),0)->
                   super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
        peVar20 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get(p_Var19);
        ppTVar12 = std::
                   vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>::
                   back((vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                         *)&node->additionalTokens);
        EVar4 = evaluateAndAllocateForAssignment(this,peVar20,*ppTVar12);
        if (EVar4 != Next) {
          this_local._7_1_ = 0;
          break;
        }
LAB_0020ba58:
        ppTVar12 = std::
                   vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>::
                   back((vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                         *)&node->additionalTokens);
        local_3f0 = *ppTVar12;
        TVar5 = TemporaryObject::getType(local_3f0);
        if (TVar5 - FrameMethod < 2) {
          pMVar14 = TemporaryObject::getSetMethod(local_3f0);
          if (pMVar14 == (Method *)0x0) goto LAB_0020bac0;
        }
        else if (TVar5 != ScopeRef && TVar5 != ObjectRef) {
LAB_0020bac0:
          p_Var19 = &std::
                     vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     ::operator[]((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                   *)(nodePhase + 0xc),0)->
                     super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
          peVar20 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get(p_Var19);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_410,"expression is not assignable",&local_411);
          e_1 = (value_type *)0x0;
          pbStack_430 = (pointer)0x0;
          local_428 = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&e_1);
          errorAtNode(&this->super_IErrorReceiver,Error,peVar20,&local_410,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&e_1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&e_1);
          std::__cxx11::string::~string((string *)&local_410);
          std::allocator<char>::~allocator((allocator<char> *)&local_411);
          pRVar21 = (RuntimeException *)__cxa_allocate_exception(0x10);
          RuntimeException::RuntimeException(pRVar21,UnsupportedOperationException);
          __cxa_throw(pRVar21,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
        }
        *(long *)phaseReference = *(long *)phaseReference + 1;
      }
      else {
        if (local_3b8 == 1) goto LAB_0020ba02;
        if (local_3b8 == 2) goto LAB_0020ba58;
      }
      srcRef.node = (ReferenceNode *)
                    std::
                    vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                    ::operator[](&local_390->map,subPhase);
      pTVar15 = Frame::pushTemporary((Frame *)node);
      array = (Array *)TemporaryObject::setRvalue(pTVar15);
      if (*(int *)&srcRef.node[1].group == 1) {
        this_02 = Reference::allocate<chatra::Array>((Reference *)&array);
        pRVar16 = &(srcRef.node)->type;
        __end8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)pRVar16);
        sourceIndex = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         pRVar16);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end8,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                           *)&sourceIndex), bVar3) {
          puVar17 = __gnu_cxx::
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&__end8);
          ref_00 = Object::ref((Object *)local_380,*puVar17);
          Array::add(this_02,ref_00);
          __gnu_cxx::
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator++(&__end8);
        }
      }
      else if (*(int *)&srcRef.node[1].group == 3) {
        this_03 = Reference::allocate<chatra::Dict>((Reference *)&array);
        pRVar16 = &(srcRef.node)->type;
        __end8_1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)pRVar16);
        sourceIndex_1 =
             (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)pRVar16);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end8_1,
                                  (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   *)&sourceIndex_1), bVar3) {
          puVar17 = __gnu_cxx::
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&__end8_1);
          key = (Key *)*puVar17;
          local_4a8 = Tuple::key(local_380,(size_t)key);
          if (local_4a8->sid == Invalid) {
            std::__cxx11::string::string((string *)&local_4c8,(string *)&local_4a8->str);
          }
          else {
            StringTable::ref_abi_cxx11_(&local_4c8,this->sTable,local_4a8->sid);
          }
          local_4d0 = (ReferenceNode *)Object::ref((Object *)local_380,(size_t)key);
          Dict::add(this_03,&local_4c8,(Reference)local_4d0);
          std::__cxx11::string::~string((string *)&local_4c8);
          __gnu_cxx::
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator++(&__end8_1);
        }
      }
      else {
        bVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &(srcRef.node)->type);
        pTVar9 = local_380;
        if (bVar3) {
          Reference::setNull((Reference *)&array);
        }
        else {
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &(srcRef.node)->type,0);
          v0_4 = (TemporaryObject *)Object::ref((Object *)pTVar9,*pvVar11);
          Reference::set((Reference *)&array,(Reference *)&v0_4);
        }
      }
      ref_1.node = (ReferenceNode *)
                   std::
                   vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>::
                   end((vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                        *)&node->additionalTokens);
      local_4e8 = __gnu_cxx::
                  __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
                  ::operator-((__normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
                               *)&ref_1,2);
      ppTVar18 = __gnu_cxx::
                 __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
                 ::operator*(&local_4e8);
      local_4e0 = *ppTVar18;
      bVar3 = TemporaryObject::hasRef(local_4e0);
      if (!bVar3) {
        *(size_t *)phaseReference = (subPhase + 1) * 4 + 0x28;
        methodCall(this,true);
        this_local._7_1_ = 0;
        break;
      }
      bVar3 = lockReference(this,local_4e0);
      if (!bVar3) {
        this_local._7_1_ = 0;
        break;
      }
      local_4f8 = TemporaryObject::getRef(local_4e0);
      bVar3 = Reference::isConst(&local_4f8);
      if (bVar3) {
        p_Var19 = &std::
                   vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ::operator[]((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                 *)(nodePhase + 0xc),0)->
                   super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
        peVar20 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get(p_Var19);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_518,"cannot modify constant reference",&local_519);
        local_538.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_538.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_538.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_538);
        errorAtNode(&this->super_IErrorReceiver,Error,peVar20,&local_518,&local_538);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_538);
        std::__cxx11::string::~string((string *)&local_518);
        std::allocator<char>::~allocator((allocator<char> *)&local_519);
        pRVar21 = (RuntimeException *)__cxa_allocate_exception(0x10);
        RuntimeException::RuntimeException(pRVar21,UnsupportedOperationException);
        __cxa_throw(pRVar21,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
      }
      bVar3 = TemporaryObject::hasArguments(local_4e0);
      if (bVar3) {
        pCVar22 = getReferClass(local_4f8);
        pCVar23 = PreDefined<chatra::FunctionObject,_(chatra::StringId)159>::getClassStatic();
        if (pCVar22 == pCVar23) goto code_r0x0020c15a;
      }
      Reference::set(&local_4f8,(Reference *)&array);
      Frame::pop((Frame *)node);
      Frame::pop((Frame *)node);
      *(size_t *)phaseReference = (subPhase + 1) * 4 + 0x28;
    } while( true );
  case 6:
    goto switchD_0020a96d_caseD_6;
  case 7:
    goto switchD_0020a96d_caseD_7;
  case 8:
    goto switchD_0020a96d_caseD_8;
  case 10:
    v1_1 = (TemporaryObject *)
           std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>::end
                     ((vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                       *)&node->additionalTokens);
    local_2e8 = __gnu_cxx::
                __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
                ::operator-((__normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
                             *)&v1_1,2);
    ppTVar18 = __gnu_cxx::
               __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
               ::operator*(&local_2e8);
    local_2e0 = *ppTVar18;
    ref.node = (ReferenceNode *)
               std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>::
               end((vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_> *)
                   &node->additionalTokens);
    local_300 = __gnu_cxx::
                __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
                ::operator-((__normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
                             *)&ref,1);
    ppTVar18 = __gnu_cxx::
               __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
               ::operator*(&local_300);
    local_2f8 = *ppTVar18;
    bVar3 = lockReference(this,local_2e0);
    if (bVar3) {
      local_310 = TemporaryObject::getRef(local_2e0);
      bVar3 = Reference::isConst(&local_310);
      if (bVar3) {
        p_Var19 = &std::
                   vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ::operator[]((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                 *)(nodePhase + 0xc),0)->
                   super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
        peVar20 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get(p_Var19);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_330,"cannot modify constant reference",&local_331);
        local_358.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_358.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_358.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_358);
        errorAtNode(&this->super_IErrorReceiver,Error,peVar20,&local_330,&local_358);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_358);
        std::__cxx11::string::~string((string *)&local_330);
        std::allocator<char>::~allocator((allocator<char> *)&local_331);
        pRVar21 = (RuntimeException *)__cxa_allocate_exception(0x10);
        RuntimeException::RuntimeException(pRVar21,UnsupportedOperationException);
        __cxa_throw(pRVar21,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
      }
      bVar3 = TemporaryObject::hasArguments(local_2e0);
      if (bVar3) {
        local_360 = local_310.node;
        pCVar22 = getReferClass(local_310);
        pCVar23 = PreDefined<chatra::FunctionObject,_(chatra::StringId)159>::getClassStatic();
        if (pCVar22 == pCVar23) {
          *(undefined8 *)phaseReference = 0x1e;
          this_local._7_1_ = 1;
          break;
        }
      }
      tmp = (TemporaryTuple *)TemporaryObject::getRef(local_2f8);
      Reference::set(&local_310,(Reference *)&tmp);
      Frame::pop((Frame *)node);
      std::
      vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
      ::pop_back((vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
                  *)&node->annotations);
      this_local._7_1_ = 1;
    }
    else {
      this_local._7_1_ = 0;
    }
    break;
  case 0x14:
    std::
    vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
    ::pop_back((vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
                *)&node->annotations);
    methodCall(this,true);
    this_local._7_1_ = 0;
    break;
  case 0x1e:
    std::
    vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
    ::pop_back((vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
                *)&node->annotations);
    methodCallViaFunctionObject(this,true,(Method *)0x0);
    this_local._7_1_ = 0;
  }
LAB_0020c251:
  return (bool)(this_local._7_1_ & 1);
code_r0x0020c15a:
  *(size_t *)phaseReference = (subPhase + 1) * 4 + 0x28;
  methodCallViaFunctionObject(this,true,(Method *)0x0);
  this_local._7_1_ = 0;
  goto LAB_0020c251;
}

Assistant:

bool Thread::assignmentOperator() {
	auto& f = frames.back();
	auto* node = f.stack.back().first;
	auto& nodePhase = f.stack.back().second;

	constexpr size_t phaseReference = 10;
	constexpr size_t phaseMethod = 20;
	constexpr size_t phaseFunctionObject = 30;
	constexpr size_t phaseTuple = 40;

	switch (nodePhase) {
	case 0:  nodePhase++;  f.stack.emplace_back(node->subNodes[0].get(), 0);  return true;
	case 1:  nodePhase++;  f.stack.emplace_back(node->subNodes[1].get(), 0);  return true;
	case assignmentOperatorEvaluationPhase:  CHATRA_EVALUATE_VALUE;
	case assignmentOperatorEvaluationPhase + 1:  nodePhase = assignmentOperatorProcessPhase;  CHATRA_FALLTHROUGH;
	case assignmentOperatorProcessPhase: {
		// Note that node->subNode[1] cannot be accessed under specific situation
		// because following logic is also used by unaryAssignmentOperator().
		auto* v0 = *(f.values.end() - 2);
		auto* v1 = *(f.values.end() - 1);

		// Tuple <- Tuple: accept
		// Scalar <- Tuple: accept only if Tuple contains a single value
		// Tuple <- Scalar: reject
		// Scaler <- Scalar: accept

		bool v0IsTuple = (v0->getType() == TemporaryObject::Type::Rvalue &&
				getReferClass(v0->getRef()) == TemporaryTuple::getClassStatic());
		bool v1IsTuple = (getReferClass(v1->getRef()) == Tuple::getClassStatic());

		if (!v0IsTuple && v1IsTuple) {
			auto& tuple = v1->getRef().deref<Tuple>();
			if (tuple.tupleSize() != 1) {
				errorAtNode(*this, ErrorLevel::Error, node, "left side is not tuple even through value of right side is tuple", {});
				throw RuntimeException(StringId::UnsupportedOperationException);
			}
			v1->getRef().set(tuple.ref(0));
			v1IsTuple = false;
		}

		if (v0IsTuple) {
			if (!v1IsTuple) {
				errorAtNode(*this, ErrorLevel::Error, node, "right side is not tuple", {});
				throw RuntimeException(StringId::UnsupportedOperationException);
			}

			std::vector<TupleAssignmentMap::Element> map;
			v0->getRef().deref<TemporaryTuple>().toArgumentMatcher().mapReturns(v1->getRef().deref<Tuple>(),
					[&](size_t destIndex, const ArgumentDef& arg, size_t srcIndex) {
						map.emplace_back(destIndex, srcIndex, arg.type);

					}, [&](size_t destIndex, const ArgumentDef& arg, std::vector<size_t> srcIndexes) {
						map.emplace_back(destIndex, std::move(srcIndexes), arg.type);

					}, [&](const std::vector<size_t>& destIndexes) {
						std::vector<size_t> empty;
						for (size_t destIndex : destIndexes)
							map.emplace_back(destIndex, empty, ArgumentDef::Type::List);
					});

			f.subStack.push_back(f.values.size());
			f.pushTemporary()->setRvalue().allocate<TupleAssignmentMap>(std::move(map));
			nodePhase = phaseTuple;
			return true;
		}

		v0->addAssignment(node, {StringId::Invalid, getReferClass(v1->getRef())});
		nodePhase++;
		CHATRA_FALLTHROUGH;
	}

	case assignmentOperatorProcessPhase + 1:
		if (evaluateAndAllocateForAssignment(node->subNodes[0].get(), *(f.values.end() - 2)) != EvaluateValueResult::Next)
			return false;
		CHATRA_FALLTHROUGH;

	case assignmentOperatorProcessPhase + 2: {
		auto* v0 = *(f.values.end() - 2);
		switch (v0->getType()) {
		case TemporaryObject::Type::ScopeRef:
		case TemporaryObject::Type::ObjectRef:
			nodePhase = phaseReference;
			return true;

		case TemporaryObject::Type::FrameMethod:
		case TemporaryObject::Type::ObjectMethod:
			if (v0->getSetMethod() != nullptr) {
				nodePhase = phaseMethod;
				return true;
			}
			CHATRA_FALLTHROUGH;

		default:
			errorAtNode(*this, ErrorLevel::Error, node->subNodes[0].get(), "expression is not assignable", {});
			throw RuntimeException(StringId::UnsupportedOperationException);
		}
	}

	case phaseReference: { // Reference; e.g. "a = 1", "b.c = 2"
		auto* v0 = *(f.values.end() - 2);
		auto* v1 = *(f.values.end() - 1);
		if (!lockReference(v0))
			return false;
		auto ref = v0->getRef();
		if (ref.isConst()) {
			errorAtNode(*this, ErrorLevel::Error, node->subNodes[0].get(), "cannot modify constant reference", {});
			throw RuntimeException(StringId::UnsupportedOperationException);
		}
		if (v0->hasArguments() && getReferClass(ref) == FunctionObject::getClassStatic()) {
			nodePhase = phaseFunctionObject;
			return true;
		}

		ref.set(v1->getRef());
		f.pop();
		f.stack.pop_back();
		return true;
	}

	case phaseMethod: {  // Method; e.g. "a.b(...) = 1" where a is an instance of some class and its class has a method "def b(...).set(r)"
		f.stack.pop_back();
		methodCall(true);
		return false;
	}

	case phaseFunctionObject: {
		f.stack.pop_back();
		methodCallViaFunctionObject(true);
		return false;
	}

	default: {
		if (nodePhase >= phaseTuple) {  // Tuple; e.g. "a, b = foo()"
			auto& tmp = f.values[f.subStack.back() - 2]->getRef().deref<TemporaryTuple>();
			auto& tuple = f.values[f.subStack.back() - 1]->getRef().deref<Tuple>();
			auto& map = f.values[f.subStack.back()]->getRef().deref<TupleAssignmentMap>();

			constexpr size_t phasesPerElem = 1U << 2U;  // = 4
			for (;;) {
				size_t phase = nodePhase - phaseTuple;
				size_t position = phase / phasesPerElem;
				size_t subPhase = phase % phasesPerElem;

				switch (subPhase) {
				case 0: {
					if (map.map.size() <= position) {
						f.popTemporaryTuple();
						f.pop();
						f.pop();
						f.pop();
						f.pushTemporary()->setRvalue().setNull();
						f.stack.pop_back();
						f.subStack.pop_back();
						return true;
					}
					auto& e = map.map[position];
					tmp.extract(e.destIndex);

					const Class* cl;
					switch (e.type) {
					case ArgumentDef::Type::ListVarArg:  cl = Array::getClassStatic();  break;
					case ArgumentDef::Type::DictVarArg:  cl = Dict::getClassStatic();  break;
					default:  cl = (e.sourceIndexes.empty() ? nullptr : getReferClass(tuple.ref(e.sourceIndexes[0])));  break;
					}
					if (cl != nullptr)
						f.values.back()->addAssignment(node, {StringId::Invalid, cl});
					nodePhase++;
					CHATRA_FALLTHROUGH;
				}

				case 1:
					if (evaluateAndAllocateForAssignment(node->subNodes[0].get(), f.values.back()) != EvaluateValueResult::Next)
						return false;
					CHATRA_FALLTHROUGH;

				case 2: {
					auto* v0 = f.values.back();
					switch (v0->getType()) {
					case TemporaryObject::Type::ScopeRef:
					case TemporaryObject::Type::ObjectRef:
						break;

					case TemporaryObject::Type::FrameMethod:
					case TemporaryObject::Type::ObjectMethod:
						if (v0->getSetMethod() != nullptr)
							break;
						CHATRA_FALLTHROUGH;

					default:
						errorAtNode(*this, ErrorLevel::Error, node->subNodes[0].get(), "expression is not assignable", {});
						throw RuntimeException(StringId::UnsupportedOperationException);
					}
					nodePhase++;
					CHATRA_FALLTHROUGH;
				}

				default: {
					auto& e = map.map[position];
					auto srcRef = f.pushTemporary()->setRvalue();
					switch (e.type) {
					case ArgumentDef::Type::ListVarArg: {
						auto& array = srcRef.allocate<Array>();
						for (size_t sourceIndex : e.sourceIndexes)
							array.add(tuple.ref(sourceIndex));
						break;
					}

					case ArgumentDef::Type::DictVarArg: {
						auto& dict = srcRef.allocate<Dict>();
						for (size_t sourceIndex : e.sourceIndexes) {
							auto& key = tuple.key(sourceIndex);
							dict.add(key.sid == StringId::Invalid ? key.str : sTable->ref(key.sid),
									tuple.ref(sourceIndex));
						}
						break;
					}

					default:
						if (e.sourceIndexes.empty())
							srcRef.setNull();
						else
							srcRef.set(tuple.ref(e.sourceIndexes[0]));
						break;
					}

					auto* v0 = *(f.values.end() - 2);
					if (v0->hasRef()) {
						if (!lockReference(v0))
							return false;
						auto ref = v0->getRef();
						if (ref.isConst()) {
							errorAtNode(*this, ErrorLevel::Error, node->subNodes[0].get(), "cannot modify constant reference", {});
							throw RuntimeException(StringId::UnsupportedOperationException);
						}
						if (v0->hasArguments() && getReferClass(ref) == FunctionObject::getClassStatic()) {
							nodePhase = phaseTuple + (position + 1) * phasesPerElem;
							methodCallViaFunctionObject(true);
							return false;
						}

						ref.set(srcRef);
						f.pop();
						f.pop();
						nodePhase = phaseTuple + (position + 1) * phasesPerElem;
					}
					else {
						nodePhase = phaseTuple + (position + 1) * phasesPerElem;
						methodCall(true);
						return false;
					}
				}
				}
			}
		}
		throw InternalError();
	}
	}
}